

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS ref_recon_rsn_hess_face(REF_GRID ref_grid,REF_DBL *hessian)

{
  uint uVar1;
  REF_GLOB local_128;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_BOOL has_support;
  REF_INT layer;
  REF_STATUS status;
  REF_DBL node_hessian [3];
  REF_DBL local_b8;
  REF_DBL n [3];
  REF_DBL local_98;
  REF_DBL s [3];
  REF_DBL local_78;
  REF_DBL r [3];
  REF_CLOUD local_58;
  REF_CLOUD ref_cloud;
  int local_48;
  REF_INT id;
  REF_INT max_id;
  REF_INT min_id;
  REF_INT im;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_CLOUD *one_layer;
  REF_DBL *hessian_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  _im = ref_grid->cell[3];
  for (min_id = 0; min_id < ((REF_NODE)ref_cell)->max; min_id = min_id + 1) {
    if (((-1 < min_id) && (min_id < ((REF_NODE)ref_cell)->max)) &&
       (-1 < ((REF_NODE)ref_cell)->global[min_id])) {
      hessian[min_id * 3] = 0.0;
      hessian[min_id * 3 + 1] = 0.0;
      hessian[min_id * 3 + 2] = 0.0;
    }
  }
  one_layer = (REF_CLOUD *)hessian;
  hessian_local = (REF_DBL *)ref_grid;
  if (((REF_NODE)ref_cell)->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x6b6,
           "ref_recon_rsn_hess_face","malloc one_layer of REF_CLOUD negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    ref_node = (REF_NODE)malloc((long)((REF_NODE)ref_cell)->max << 3);
    if (ref_node == (REF_NODE)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x6b6
             ,"ref_recon_rsn_hess_face","malloc one_layer of REF_CLOUD NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0;
          ref_private_macro_code_rss_1 < ref_cell->last_node_is_an_id;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        *(undefined8 *)(&ref_node->n + (long)ref_private_macro_code_rss_1 * 2) = 0;
      }
      uVar1 = ref_cell_id_range(_im,(REF_MPI)*hessian_local,&id,&local_48);
      if (uVar1 == 0) {
        for (ref_cloud._4_4_ = id; (int)ref_cloud._4_4_ <= local_48;
            ref_cloud._4_4_ = ref_cloud._4_4_ + 1) {
          for (min_id = 0; min_id < ref_cell->last_node_is_an_id; min_id = min_id + 1) {
            if (((-1 < min_id) && (min_id < ref_cell->last_node_is_an_id)) &&
               ((-1 < *(long *)(*(long *)&ref_cell->edge_per + (long)min_id * 8) &&
                (uVar1 = ref_cloud_create((REF_CLOUD *)(&ref_node->n + (long)min_id * 2),4),
                uVar1 != 0)))) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x6bc,"ref_recon_rsn_hess_face",(ulong)uVar1,"cloud storage");
              return uVar1;
            }
          }
          uVar1 = ref_recon_local_immediate_cloud_geom
                            ((REF_CLOUD *)ref_node,(REF_GRID)hessian_local,ref_cloud._4_4_);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x6bf,"ref_recon_rsn_hess_face",(ulong)uVar1,"fill immediate cloud");
            return uVar1;
          }
          uVar1 = ref_recon_ghost_cloud((REF_CLOUD *)ref_node,(REF_NODE)ref_cell);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x6c0,"ref_recon_rsn_hess_face",(ulong)uVar1,"fill ghosts");
            return uVar1;
          }
          for (min_id = 0; min_id < ref_cell->last_node_is_an_id; min_id = min_id + 1) {
            if (((-1 < min_id) && (min_id < ref_cell->last_node_is_an_id)) &&
               (-1 < *(long *)(*(long *)&ref_cell->edge_per + (long)min_id * 8))) {
              uVar1 = ref_geom_id_supported
                                ((REF_GEOM)hessian_local[0x13],min_id,2,ref_cloud._4_4_,
                                 &ref_private_macro_code_rss);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x6c5,"ref_recon_rsn_hess_face",(ulong)uVar1,"geom support");
                return uVar1;
              }
              if ((ref_private_macro_code_rss != 0) &&
                 (*(int *)(*(long *)&ref_cell[1].size_per + 4) ==
                  *(int *)(*(long *)&ref_cell->n + (long)min_id * 4))) {
                uVar1 = ref_recon_rsn((REF_GRID)hessian_local,min_id,&local_78,&local_98,&local_b8);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x6c7,"ref_recon_rsn_hess_face",(ulong)uVar1,"rsn");
                  return uVar1;
                }
                uVar1 = ref_cloud_deep_copy(&local_58,
                                            *(REF_CLOUD *)(&ref_node->n + (long)min_id * 2));
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x6ca,"ref_recon_rsn_hess_face",(ulong)uVar1,"create ref_cloud");
                  return uVar1;
                }
                has_support = 3;
                for (ref_malloc_init_i = 2; has_support != 0 && ref_malloc_init_i < 9;
                    ref_malloc_init_i = ref_malloc_init_i + 1) {
                  uVar1 = ref_recon_grow_cloud_one_layer
                                    (local_58,(REF_CLOUD *)ref_node,(REF_NODE)ref_cell);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x6ce,"ref_recon_rsn_hess_face",(ulong)uVar1,"grow");
                    return uVar1;
                  }
                  if (((min_id < 0) || (ref_cell->last_node_is_an_id <= min_id)) ||
                     (*(long *)(*(long *)&ref_cell->edge_per + (long)min_id * 8) < 0)) {
                    local_128 = -1;
                  }
                  else {
                    local_128 = *(REF_GLOB *)(*(long *)&ref_cell->edge_per + (long)min_id * 8);
                  }
                  has_support = ref_recon_kexact_rs(local_128,local_58,&local_78,&local_98,
                                                    (REF_DBL *)&layer);
                  if ((has_support == 4) && (4 < ref_malloc_init_i)) {
                    ref_node_location((REF_NODE)ref_cell,min_id);
                    printf(" caught %s, for %d layers to kexact cloud; retry\n","REF_DIV_ZERO",
                           (ulong)(uint)ref_malloc_init_i);
                  }
                  if ((has_support == 8) && (4 < ref_malloc_init_i)) {
                    ref_node_location((REF_NODE)ref_cell,min_id);
                    printf(" caught %s, for %d layers to kexact cloud; retry\n",
                           "REF_ILL_CONDITIONED",(ulong)(uint)ref_malloc_init_i);
                  }
                }
                if (has_support == 0) {
                  if ((double)one_layer[(long)(min_id * 3) + 2] *
                      (double)one_layer[(long)(min_id * 3) + 2] +
                      (double)one_layer[min_id * 3] * (double)one_layer[min_id * 3] +
                      (double)one_layer[(long)(min_id * 3) + 1] *
                      (double)one_layer[(long)(min_id * 3) + 1] <
                      node_hessian[1] * node_hessian[1] +
                      _layer * _layer + node_hessian[0] * node_hessian[0]) {
                    for (max_id = 0; max_id < 3; max_id = max_id + 1) {
                      one_layer[max_id + min_id * 3] = *(REF_CLOUD *)(&layer + (long)max_id * 2);
                    }
                  }
                }
                else {
                  printf("skip contribution to face %d at ",(ulong)ref_cloud._4_4_);
                  uVar1 = ref_node_location((REF_NODE)ref_cell,min_id);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x6e6,"ref_recon_rsn_hess_face",(ulong)uVar1,"loc");
                    return uVar1;
                  }
                }
                uVar1 = ref_cloud_free(local_58);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x6e9,"ref_recon_rsn_hess_face",(ulong)uVar1,"free ref_cloud");
                  return uVar1;
                }
              }
            }
          }
          for (min_id = 0; min_id < ref_cell->last_node_is_an_id; min_id = min_id + 1) {
            if (((-1 < min_id) && (min_id < ref_cell->last_node_is_an_id)) &&
               (-1 < *(long *)(*(long *)&ref_cell->edge_per + (long)min_id * 8))) {
              ref_cloud_free(*(REF_CLOUD *)(&ref_node->n + (long)min_id * 2));
            }
          }
        }
        if (ref_node != (REF_NODE)0x0) {
          free(ref_node);
        }
        uVar1 = ref_node_ghost_dbl((REF_NODE)ref_cell,(REF_DBL *)one_layer,3);
        if (uVar1 == 0) {
          ref_grid_local._4_4_ =
               ref_recon_abs_value_hessian2((REF_GRID)hessian_local,(REF_DBL *)one_layer);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x6f5,"ref_recon_rsn_hess_face",(ulong)ref_grid_local._4_4_,"abs(H)");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x6f3,"ref_recon_rsn_hess_face",(ulong)uVar1,"update ghosts");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x6b8,"ref_recon_rsn_hess_face",(ulong)uVar1,"face id range");
        ref_grid_local._4_4_ = uVar1;
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_recon_rsn_hess_face(REF_GRID ref_grid,
                                           REF_DBL *hessian) {
  REF_CLOUD *one_layer;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node, im, min_id, max_id, id;
  REF_CLOUD ref_cloud;
  REF_DBL r[3], s[3], n[3];
  REF_DBL node_hessian[3];
  REF_STATUS status;
  REF_INT layer;
  REF_BOOL has_support;

  each_ref_node_valid_node(ref_node, node) {
    hessian[0 + 3 * node] = 0.0;
    hessian[1 + 3 * node] = 0.0;
    hessian[2 + 3 * node] = 0.0;
  }

  ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
  RSS(ref_cell_id_range(ref_cell, ref_grid_mpi(ref_grid), &min_id, &max_id),
      "face id range");

  for (id = min_id; id <= max_id; id++) {
    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
    }
    RSS(ref_recon_local_immediate_cloud_geom(one_layer, ref_grid, id),
        "fill immediate cloud");
    RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");

    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_geom_id_supported(ref_grid_geom(ref_grid), node, REF_GEOM_FACE,
                                id, &has_support),
          "geom support");
      if (has_support && ref_node_owned(ref_node, node)) {
        RSS(ref_recon_rsn(ref_grid, node, r, s, n), "rsn");
        /* use ref_cloud to get a unique list of halo(2) nodes */
        RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]),
            "create ref_cloud");
        status = REF_INVALID;
        for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
          RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
              "grow");

          status = ref_recon_kexact_rs(ref_node_global(ref_node, node),
                                       ref_cloud, r, s, node_hessian);
          if (REF_DIV_ZERO == status && layer > 4) {
            ref_node_location(ref_node, node);
            printf(" caught %s, for %d layers to kexact cloud; retry\n",
                   "REF_DIV_ZERO", layer);
          }
          if (REF_ILL_CONDITIONED == status && layer > 4) {
            ref_node_location(ref_node, node);
            printf(" caught %s, for %d layers to kexact cloud; retry\n",
                   "REF_ILL_CONDITIONED", layer);
          }
        }
        if (REF_SUCCESS == status) {
          if (ref_math_dot(&(hessian[3 * node]), &(hessian[3 * node])) <
              ref_math_dot(node_hessian, node_hessian)) {
            for (im = 0; im < 3; im++) {
              hessian[im + 3 * node] = node_hessian[im];
            }
          }
        } else {
          printf("skip contribution to face %d at ", id);
          RSS(ref_node_location(ref_node, node), "loc");
        }

        RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
      }
    }

    each_ref_node_valid_node(ref_node, node) {
      ref_cloud_free(one_layer[node]); /* no-op for null */
    }
  }
  ref_free(one_layer);

  RSS(ref_node_ghost_dbl(ref_node, hessian, 3), "update ghosts");

  RSS(ref_recon_abs_value_hessian2(ref_grid, hessian), "abs(H)");

  return REF_SUCCESS;
}